

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldMetadata
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  uint32_t u32;
  int iVar3;
  int iVar4;
  Type TVar5;
  WireType WVar6;
  CppType CVar7;
  FieldGenerator *generator_00;
  LogMessage *other;
  iterator iVar8;
  iterator iVar9;
  size_type sVar10;
  reference ppEVar11;
  reference ppFVar12;
  Options *options;
  OneofDescriptor *pOVar13;
  string *psVar14;
  Descriptor *pDVar15;
  MessageOptions *this_00;
  mapped_type *pmVar16;
  FieldOptions *this_01;
  reference value;
  size_type sVar17;
  FileDescriptor *file;
  char *pcVar18;
  Options *in_RCX;
  int __c;
  int __c_00;
  FieldDescriptor *field_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_01;
  AlphaNum *a_03;
  allocator local_761;
  undefined1 local_760 [8];
  string serializer;
  int num_field_metadata;
  unsigned_long local_718;
  allocator local_709;
  string local_708;
  allocator local_6e1;
  key_type local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  uint32_t local_67c;
  FieldGenerator *pFStack_678;
  int type;
  FieldGenerator *generator_1;
  string local_640;
  allocator local_619;
  string local_618;
  string local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  string local_578;
  int local_558;
  allocator local_551;
  undefined1 local_550 [8];
  string ptr;
  string local_528;
  undefined1 local_508 [8];
  string classfieldname;
  uint32_t tag_1;
  FieldDescriptor *field_1;
  ExtensionRange *range;
  int local_4c8;
  int extension_idx;
  int i_2;
  ExtensionRange *local_4b0;
  int local_4a4;
  undefined1 local_4a0 [4];
  int i_1;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  SaveState saver;
  key_type local_448;
  AlphaNum local_428;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  LogFinisher local_32a;
  byte local_329;
  LogMessage local_328;
  allocator local_2e9;
  key_type local_2e8;
  allocator local_2c1;
  key_type local_2c0;
  AlphaNum local_2a0;
  string local_270;
  allocator local_249;
  key_type local_248;
  AlphaNum local_228;
  string local_1f8;
  allocator local_1d1;
  key_type local_1d0;
  AlphaNum local_1b0;
  string local_180;
  allocator local_159;
  key_type local_158;
  string local_138;
  allocator local_111;
  key_type local_110;
  string local_f0;
  undefined1 local_d0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  uint32_t tag;
  FieldGenerator *generator;
  FieldDescriptor *field;
  int i;
  undefined1 local_78 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  sorted;
  undefined1 local_58 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  if (((this->options_).table_driven_serialization & 1U) == 0) {
    this_local._4_4_ = 0;
    sorted.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    anon_unknown_0::SortFieldsByNumber
              ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_78,this->descriptor_);
    bVar2 = IsMapEntryMessage(this->descriptor_);
    if (bVar2) {
      for (field._0_4_ = 0; (int)field < 2; field._0_4_ = (int)field + 1) {
        ppFVar12 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 *)local_78,(long)(int)field);
        pFVar1 = *ppFVar12;
        generator_00 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
        iVar3 = FieldDescriptor::number(pFVar1);
        TVar5 = FieldDescriptor::type(pFVar1);
        WVar6 = internal::WireFormat::WireTypeForFieldType(TVar5);
        vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             internal::WireFormatLite::MakeTag(iVar3,WVar6);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_d0);
        QualifiedClassName_abi_cxx11_
                  (&local_f0,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_110,"classtype",&local_111);
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0,&local_110);
        std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
        std::__cxx11::string::~string((string *)&local_f0);
        FieldName_abi_cxx11_(&local_138,(cpp *)pFVar1,field_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,"field_name",&local_159);
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0,&local_158);
        std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        std::__cxx11::string::~string((string *)&local_138);
        strings::AlphaNum::AlphaNum
                  (&local_1b0,vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        StrCat_abi_cxx11_(&local_180,(protobuf *)&local_1b0,a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1d0,"tag",&local_1d1);
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0,&local_1d0);
        std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        std::__cxx11::string::~string((string *)&local_180);
        strings::AlphaNum::AlphaNum(&local_228,(int)field);
        StrCat_abi_cxx11_(&local_1f8,(protobuf *)&local_228,a_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_248,"hasbit",&local_249);
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0,&local_248);
        std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        std::__cxx11::string::~string((string *)&local_1f8);
        u32 = anon_unknown_0::CalcFieldNum(generator_00,pFVar1,&this->options_);
        strings::AlphaNum::AlphaNum(&local_2a0,u32);
        StrCat_abi_cxx11_(&local_270,(protobuf *)&local_2a0,a_01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c0,"type",&local_2c1);
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0,&local_2c0);
        std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_270);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2e8,"ptr",&local_2e9);
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0,&local_2e8);
        std::__cxx11::string::operator=((string *)pmVar16,"nullptr");
        std::__cxx11::string::~string((string *)&local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        CVar7 = FieldDescriptor::cpp_type(pFVar1);
        if (CVar7 == CPPTYPE_MESSAGE) {
          local_329 = 0;
          pDVar15 = FieldDescriptor::message_type(pFVar1);
          bVar2 = IsMapEntryMessage(pDVar15);
          if (bVar2) {
            internal::LogMessage::LogMessage
                      (&local_328,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x870);
            local_329 = 1;
            other = internal::LogMessage::operator<<
                              (&local_328,
                               "CHECK failed: !IsMapEntryMessage(field->message_type()): ");
            internal::LogFinisher::operator=(&local_32a,other);
          }
          if ((local_329 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_328);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3d0,"TableStruct",&local_3d1);
          pDVar15 = FieldDescriptor::message_type(pFVar1);
          in_RCX = &this->options_;
          UniqueName(&local_3b0,&local_3d0,pDVar15,in_RCX);
          std::operator+(&local_390,"::",&local_3b0);
          std::operator+(&local_370,&local_390,"::serialization_table + ");
          pDVar15 = FieldDescriptor::message_type(pFVar1);
          iVar3 = anon_unknown_0::FindMessageIndexInFile(pDVar15);
          strings::AlphaNum::AlphaNum(&local_428,iVar3);
          StrCat_abi_cxx11_(&local_3f8,(protobuf *)&local_428,a_02);
          std::operator+(&local_350,&local_370,&local_3f8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_448,"ptr",
                     (allocator *)
                     ((long)&saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_d0,&local_448);
          std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_350);
          std::__cxx11::string::~string((string *)&local_448);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        }
        Formatter::SaveState::SaveState
                  ((SaveState *)
                   &sorted_extensions.
                    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Formatter *)local_58);
        Formatter::AddMap((Formatter *)local_58,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_d0);
        Formatter::operator()<>
                  ((Formatter *)local_58,
                   "{PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, $field_name$_), $tag$,PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, _has_bits_) * 8 + $hasbit$, $type$, $ptr$},\n"
                  );
        Formatter::SaveState::~SaveState
                  ((SaveState *)
                   &sorted_extensions.
                    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_d0);
      }
      this_local._4_4_ = 2;
      sorted.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_58,
                 "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_), 0, 0, 0, nullptr},\n");
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                *)local_4a0);
      iVar3 = Descriptor::extension_range_count(this->descriptor_);
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::reserve((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_4a0,(long)iVar3);
      for (local_4a4 = 0; iVar3 = local_4a4,
          iVar4 = Descriptor::extension_range_count(this->descriptor_), iVar3 < iVar4;
          local_4a4 = local_4a4 + 1) {
        local_4b0 = Descriptor::extension_range(this->descriptor_,local_4a4);
        std::
        vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     *)local_4a0,&local_4b0);
      }
      iVar8 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                       *)local_4a0);
      iVar9 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     *)local_4a0);
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>
                (iVar8._M_current,iVar9._M_current);
      local_4c8 = 0;
      range._4_4_ = 0;
      while( true ) {
        while( true ) {
          sVar10 = std::
                   vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                           *)local_4a0);
          bVar2 = false;
          if ((ulong)(long)range._4_4_ < sVar10) {
            sVar10 = std::
                     vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_78);
            bVar2 = true;
            if ((long)local_4c8 != sVar10) {
              ppEVar11 = std::
                         vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                       *)local_4a0,(long)range._4_4_);
              iVar3 = (*ppEVar11)->start;
              ppFVar12 = std::
                         vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                       *)local_78,(long)local_4c8);
              iVar4 = FieldDescriptor::number(*ppFVar12);
              bVar2 = iVar3 < iVar4;
            }
          }
          if (!bVar2) break;
          ppEVar11 = std::
                     vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                   *)local_4a0,(long)range._4_4_);
          Formatter::operator()
                    ((Formatter *)local_58,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::ExtensionSerializer)},\n"
                     ,&(*ppEVar11)->start,&(*ppEVar11)->end);
          range._4_4_ = range._4_4_ + 1;
        }
        options = (Options *)
                  std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)local_78);
        if ((Options *)(long)local_4c8 == options) break;
        ppFVar12 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 *)local_78,(long)local_4c8);
        pFVar1 = *ppFVar12;
        iVar3 = FieldDescriptor::number(pFVar1);
        TVar5 = FieldDescriptor::type(pFVar1);
        WVar6 = internal::WireFormat::WireTypeForFieldType(TVar5);
        classfieldname.field_2._12_4_ = internal::WireFormatLite::MakeTag(iVar3,WVar6);
        bVar2 = FieldDescriptor::is_packed(pFVar1);
        field_01 = extraout_RDX;
        if (bVar2) {
          iVar3 = FieldDescriptor::number(pFVar1);
          classfieldname.field_2._12_4_ =
               internal::WireFormatLite::MakeTag(iVar3,WIRETYPE_LENGTH_DELIMITED);
          field_01 = extraout_RDX_00;
        }
        FieldName_abi_cxx11_((string *)local_508,(cpp *)pFVar1,field_01);
        pOVar13 = FieldDescriptor::real_containing_oneof(pFVar1);
        if (pOVar13 != (OneofDescriptor *)0x0) {
          pOVar13 = FieldDescriptor::containing_oneof(pFVar1);
          psVar14 = OneofDescriptor::name_abi_cxx11_(pOVar13);
          std::__cxx11::string::operator=((string *)local_508,(string *)psVar14);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_528,"field_name",(allocator *)(ptr.field_2._M_local_buf + 0xf));
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)local_58,&local_528,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508);
        std::__cxx11::string::~string((string *)&local_528);
        std::allocator<char>::~allocator((allocator<char> *)(ptr.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_550,"nullptr",&local_551);
        std::allocator<char>::~allocator((allocator<char> *)&local_551);
        CVar7 = FieldDescriptor::cpp_type(pFVar1);
        if (CVar7 == CPPTYPE_MESSAGE) {
          pDVar15 = FieldDescriptor::message_type(pFVar1);
          bVar2 = IsMapEntryMessage(pDVar15);
          if (!bVar2) {
            pDVar15 = FieldDescriptor::message_type(pFVar1);
            this_00 = Descriptor::options(pDVar15);
            bVar2 = MessageOptions::message_set_wire_format(this_00);
            if (!bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_618,"TableStruct",&local_619);
              pDVar15 = FieldDescriptor::message_type(pFVar1);
              UniqueName(&local_5f8,&local_618,pDVar15,&this->options_);
              std::operator+(&local_5d8,"::",&local_5f8);
              std::operator+(&local_5b8,&local_5d8,"::serialization_table + ");
              pDVar15 = FieldDescriptor::message_type(pFVar1);
              iVar3 = anon_unknown_0::FindMessageIndexInFile(pDVar15);
              strings::AlphaNum::AlphaNum((AlphaNum *)&generator_1,iVar3);
              StrCat_abi_cxx11_(&local_640,(protobuf *)&generator_1,a_03);
              std::operator+(&local_598,&local_5b8,&local_640);
              std::__cxx11::string::operator=((string *)local_550,(string *)&local_598);
              std::__cxx11::string::~string((string *)&local_598);
              std::__cxx11::string::~string((string *)&local_640);
              std::__cxx11::string::~string((string *)&local_5b8);
              std::__cxx11::string::~string((string *)&local_5d8);
              std::__cxx11::string::~string((string *)&local_5f8);
              std::__cxx11::string::~string((string *)&local_618);
              std::allocator<char>::~allocator((allocator<char> *)&local_619);
            }
            goto LAB_00519bf9;
          }
          pDVar15 = FieldDescriptor::message_type(pFVar1);
          local_558 = anon_unknown_0::FindMessageIndexInFile(pDVar15);
          pDVar15 = FieldDescriptor::message_type(pFVar1);
          QualifiedClassName_abi_cxx11_
                    (&local_578,(cpp *)pDVar15,(Descriptor *)&this->options_,options);
          Formatter::operator()
                    ((Formatter *)local_58,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(static_cast< ::$proto_ns$::internal::SpecialSerializer>(::$proto_ns$::internal::MapFieldSerializer< ::$proto_ns$::internal::MapEntryToMapField<$3$>::MapFieldType, $tablename$::serialization_table>))},\n"
                     ,(uint *)(classfieldname.field_2._M_local_buf + 0xc),&local_558,&local_578);
          std::__cxx11::string::~string((string *)&local_578);
          sorted.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
        }
        else {
LAB_00519bf9:
          pFStack_678 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
          local_67c = anon_unknown_0::CalcFieldNum(pFStack_678,pFVar1,&this->options_);
          bVar2 = IsLazy(pFVar1,&this->options_,this->scc_analyzer_);
          if (bVar2) {
            local_67c = 0x69;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_6e0,"proto_ns",&local_6e1);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&this->variables_,&local_6e0);
            std::operator+(&local_6c0,"reinterpret_cast<const void*>(::",pmVar16);
            std::operator+(&local_6a0,&local_6c0,"::internal::LazyFieldSerializer");
            std::__cxx11::string::operator=((string *)local_550,(string *)&local_6a0);
            std::__cxx11::string::~string((string *)&local_6a0);
            std::__cxx11::string::~string((string *)&local_6c0);
            std::__cxx11::string::~string((string *)&local_6e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
            pOVar13 = FieldDescriptor::real_containing_oneof(pFVar1);
            if (pOVar13 == (OneofDescriptor *)0x0) {
              bVar2 = HasHasbit(pFVar1);
              if (!bVar2) {
                std::__cxx11::string::operator+=((string *)local_550,"NoPresence");
              }
            }
            else {
              std::__cxx11::string::operator+=((string *)local_550,"OneOf");
            }
            std::__cxx11::string::operator+=((string *)local_550,")");
          }
          this_01 = FieldDescriptor::options(pFVar1);
          bVar2 = FieldOptions::weak(this_01);
          if (bVar2) {
            Formatter::operator()
                      ((Formatter *)local_58,
                       "{PROTOBUF_FIELD_OFFSET($classtype$, _weak_field_map_), $1$, $1$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n"
                       ,(uint *)(classfieldname.field_2._M_local_buf + 0xc));
          }
          else {
            pOVar13 = FieldDescriptor::real_containing_oneof(pFVar1);
            if (pOVar13 == (OneofDescriptor *)0x0) {
              bVar2 = HasHasbit(pFVar1);
              if (bVar2) {
                std::allocator<char>::allocator();
                pcVar18 = "hasbitsoffset";
                std::__cxx11::string::string
                          ((string *)&num_field_metadata,"hasbitsoffset",
                           (allocator *)(serializer.field_2._M_local_buf + 0xf));
                pcVar18 = FieldDescriptor::index(pFVar1,pcVar18,__c_00);
                value = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&this->has_bit_indices_,(long)(int)pcVar18);
                Formatter::Set<int>((Formatter *)local_58,(string *)&num_field_metadata,value);
                std::__cxx11::string::~string((string *)&num_field_metadata);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(serializer.field_2._M_local_buf + 0xf));
                Formatter::operator()
                          ((Formatter *)local_58,
                           "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + $hasbitsoffset$, $2$, $3$},\n"
                           ,(uint *)(classfieldname.field_2._M_local_buf + 0xc),(int *)&local_67c,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
              }
              else {
                Formatter::operator()
                          ((Formatter *)local_58,
                           "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
                           ,(uint *)(classfieldname.field_2._M_local_buf + 0xc),(int *)&local_67c,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
              }
            }
            else {
              std::allocator<char>::allocator();
              pcVar18 = "oneofoffset";
              std::__cxx11::string::string((string *)&local_708,"oneofoffset",&local_709);
              pOVar13 = FieldDescriptor::containing_oneof(pFVar1);
              pcVar18 = OneofDescriptor::index(pOVar13,pcVar18,__c);
              local_718 = (long)(int)pcVar18 << 2;
              Formatter::Set<unsigned_long>((Formatter *)local_58,&local_708,&local_718);
              std::__cxx11::string::~string((string *)&local_708);
              std::allocator<char>::~allocator((allocator<char> *)&local_709);
              Formatter::operator()
                        ((Formatter *)local_58,
                         "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + $oneofoffset$, $2$, $3$},\n"
                         ,(uint *)(classfieldname.field_2._M_local_buf + 0xc),(int *)&local_67c,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_550);
            }
          }
          sorted.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_550);
        std::__cxx11::string::~string((string *)local_508);
        local_4c8 = local_4c8 + 1;
      }
      sVar10 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)local_78);
      sVar17 = std::
               vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                       *)local_4a0);
      serializer.field_2._8_4_ = (int)sVar10 + (int)sVar17 + 2;
      file = Descriptor::file(this->descriptor_);
      bVar2 = UseUnknownFieldSet(file,&this->options_);
      pcVar18 = "UnknownFieldSerializerLite";
      if (bVar2) {
        pcVar18 = "UnknownFieldSetSerializer";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_760,pcVar18,&local_761);
      std::allocator<char>::~allocator((allocator<char> *)&local_761);
      Formatter::operator()
                ((Formatter *)local_58,
                 "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::$1$)},\n"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760);
      this_local._4_4_ = serializer.field_2._8_4_;
      sorted.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_760);
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_4a0);
    }
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_78);
  }
  Formatter::~Formatter((Formatter *)local_58);
  return this_local._4_4_;
}

Assistant:

int MessageGenerator::GenerateFieldMetadata(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!options_.table_driven_serialization) {
    return 0;
  }

  std::vector<const FieldDescriptor*> sorted = SortFieldsByNumber(descriptor_);
  if (IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < 2; i++) {
      const FieldDescriptor* field = sorted[i];
      const FieldGenerator& generator = field_generators_.get(field);

      uint32_t tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormat::WireTypeForFieldType(field->type()));

      std::map<std::string, std::string> vars;
      vars["classtype"] = QualifiedClassName(descriptor_, options_);
      vars["field_name"] = FieldName(field);
      vars["tag"] = StrCat(tag);
      vars["hasbit"] = StrCat(i);
      vars["type"] = StrCat(CalcFieldNum(generator, field, options_));
      vars["ptr"] = "nullptr";
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_CHECK(!IsMapEntryMessage(field->message_type()));
        vars["ptr"] =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
      Formatter::SaveState saver(&format);
      format.AddMap(vars);
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, $field_name$_), $tag$,"
          "PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, _has_bits_) * 8 + $hasbit$, $type$, "
          "$ptr$},\n");
    }
    return 2;
  }
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_),"
      " 0, 0, 0, nullptr},\n");
  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  sorted_extensions.reserve(descriptor_->extension_range_count());
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  for (int i = 0, extension_idx = 0; /* no range */; i++) {
    for (; extension_idx < sorted_extensions.size() &&
           (i == sorted.size() ||
            sorted_extensions[extension_idx]->start < sorted[i]->number());
         extension_idx++) {
      const Descriptor::ExtensionRange* range =
          sorted_extensions[extension_idx];
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), "
          "$1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::ExtensionSerializer)},\n",
          range->start, range->end);
    }
    if (i == sorted.size()) break;
    const FieldDescriptor* field = sorted[i];

    uint32_t tag = internal::WireFormatLite::MakeTag(
        field->number(), WireFormat::WireTypeForFieldType(field->type()));
    if (field->is_packed()) {
      tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    }

    std::string classfieldname = FieldName(field);
    if (field->real_containing_oneof()) {
      classfieldname = field->containing_oneof()->name();
    }
    format.Set("field_name", classfieldname);
    std::string ptr = "nullptr";
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsMapEntryMessage(field->message_type())) {
        format(
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, "
            "::$proto_ns$::internal::FieldMetadata::kSpecial, "
            "reinterpret_cast<const void*>(static_cast< "
            "::$proto_ns$::internal::SpecialSerializer>("
            "::$proto_ns$::internal::MapFieldSerializer< "
            "::$proto_ns$::internal::MapEntryToMapField<"
            "$3$>::MapFieldType, "
            "$tablename$::serialization_table>))},\n",
            tag, FindMessageIndexInFile(field->message_type()),
            QualifiedClassName(field->message_type(), options_));
        continue;
      } else if (!field->message_type()->options().message_set_wire_format()) {
        // message_set doesn't have the usual table and we need to
        // dispatch to generated serializer, hence ptr stays zero.
        ptr =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
    }

    const FieldGenerator& generator = field_generators_.get(field);
    int type = CalcFieldNum(generator, field, options_);

    if (IsLazy(field, options_, scc_analyzer_)) {
      type = internal::FieldMetadata::kSpecial;
      ptr = "reinterpret_cast<const void*>(::" + variables_["proto_ns"] +
            "::internal::LazyFieldSerializer";
      if (field->real_containing_oneof()) {
        ptr += "OneOf";
      } else if (!HasHasbit(field)) {
        ptr += "NoPresence";
      }
      ptr += ")";
    }

    if (field->options().weak()) {
      // TODO(gerbens) merge weak fields into ranges
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "$classtype$, _weak_field_map_), $1$, $1$, "
          "::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n",
          tag);
    } else if (field->real_containing_oneof()) {
      format.Set("oneofoffset",
                 sizeof(uint32_t) * field->containing_oneof()->index());
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$,"
          " PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + "
          "$oneofoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else if (HasHasbit(field)) {
      format.Set("hasbitsoffset", has_bit_indices_[field->index()]);
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + "
          "$hasbitsoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else {
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, ~0u, $2$, $3$},\n",
          tag, type, ptr);
    }
  }
  int num_field_metadata = 1 + sorted.size() + sorted_extensions.size();
  num_field_metadata++;
  std::string serializer = UseUnknownFieldSet(descriptor_->file(), options_)
                               ? "UnknownFieldSetSerializer"
                               : "UnknownFieldSerializerLite";
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, "
      "::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const "
      "void*>(::$proto_ns$::internal::$1$)},\n",
      serializer);
  return num_field_metadata;
}